

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCues.cpp
# Opt level: O3

KaxCuePoint * __thiscall libmatroska::KaxCues::GetTimecodePoint(KaxCues *this,uint64 aTimecode)

{
  ulong uVar1;
  EbmlMaster *this_00;
  int iVar2;
  undefined4 extraout_var;
  EbmlUInteger *this_01;
  ulong uVar3;
  pointer ppEVar4;
  EbmlMaster *pEVar5;
  EbmlMaster *pEVar6;
  ulong uVar7;
  
  if (this->bGlobalTimecodeScaleIsSet == false) {
    __assert_fail("bGlobalTimecodeScaleIsSet",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/./matroska/KaxCues.h"
                  ,0x4f,"uint64 libmatroska::KaxCues::GlobalTimecodeScale() const");
  }
  pEVar5 = (EbmlMaster *)0x0;
  uVar1 = this->mGlobalTimecodeScale;
  ppEVar4 = (this->super_EbmlMaster).ElementList.
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar4 !=
      (this->super_EbmlMaster).ElementList.
      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pEVar6 = (EbmlMaster *)0x0;
    uVar7 = 0;
    do {
      iVar2 = (*(*ppEVar4)->_vptr_EbmlElement[3])();
      pEVar5 = pEVar6;
      uVar3 = uVar7;
      if ((*(long *)(KaxCuePoint::ClassInfos._8_8_ + 8) ==
           *(long *)((int *)CONCAT44(extraout_var,iVar2) + 2)) &&
         (*(int *)KaxCuePoint::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var,iVar2))) {
        this_00 = (EbmlMaster *)*ppEVar4;
        this_01 = (EbmlUInteger *)
                  libebml::EbmlMaster::FindFirstElt(this_00,(EbmlCallbacks *)KaxCueTime::ClassInfos)
        ;
        if ((this_01 != (EbmlUInteger *)0x0) &&
           (uVar3 = libebml::EbmlUInteger::operator_cast_to_unsigned_long(this_01), pEVar5 = this_00
           , uVar3 <= uVar7 || aTimecode / uVar1 <= uVar3)) {
          pEVar5 = pEVar6;
          uVar3 = uVar7;
        }
      }
      ppEVar4 = ppEVar4 + 1;
      pEVar6 = pEVar5;
      uVar7 = uVar3;
    } while (ppEVar4 !=
             (this->super_EbmlMaster).ElementList.
             super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return (KaxCuePoint *)pEVar5;
}

Assistant:

void KaxCues::PositionSet(const KaxBlockBlob & BlockReference)
{
  // look for the element in the temporary references
  std::vector<const KaxBlockBlob *>::iterator ListIdx;

  for (ListIdx = myTempReferences.begin(); ListIdx != myTempReferences.end(); ++ListIdx) {
    if (*ListIdx == &BlockReference) {
      // found, now add the element to the entry list
      KaxCuePoint & NewPoint = AddNewChild<KaxCuePoint>(*this);
      NewPoint.PositionSet(BlockReference, GlobalTimecodeScale());
      myTempReferences.erase(ListIdx);
      break;
    }
  }
}